

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xer_decoder.c
# Opt level: O1

int xer_skip_unknown(xer_check_tag_e tcv,ber_tlv_len_t *depth)

{
  if (XCT_UNKNOWN_BO < tcv) {
    return -1;
  }
  if ((0x22U >> (tcv & 0x1f) & 1) == 0) {
    if ((0x44U >> (tcv & 0x1f) & 1) == 0) {
      if ((0x88U >> (tcv & 0x1f) & 1) == 0) {
        return -1;
      }
    }
    else {
      *depth = *depth + -1;
      if (*depth == 0) {
        return (tcv == XCT_CLOSING) + 1;
      }
    }
    return 0;
  }
  *depth = *depth + 1;
  return 0;
}

Assistant:

int
xer_skip_unknown(xer_check_tag_e tcv, ber_tlv_len_t *depth) {
	assert(*depth > 0);
	switch(tcv) {
	case XCT_BOTH:
	case XCT_UNKNOWN_BO:
		/* These negate each other. */
		return 0;
	case XCT_OPENING:
	case XCT_UNKNOWN_OP:
		++(*depth);
		return 0;
	case XCT_CLOSING:
	case XCT_UNKNOWN_CL:
		if(--(*depth) == 0)
			return (tcv == XCT_CLOSING) ? 2 : 1;
		return 0;
	default:
		return -1;
	}
}